

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this)

{
  uint uVar1;
  TypeInfo *pTVar2;
  Descriptor *pDVar3;
  long lVar4;
  DynamicMessageFactory *this_00;
  DynamicMessage *pDVar5;
  bool bVar6;
  Type TVar7;
  undefined4 uVar8;
  uint *puVar9;
  Descriptor *type;
  Message *default_entry;
  EnumValueDescriptor *pEVar10;
  _func_int **pp_Var11;
  int iVar12;
  int iVar13;
  DynamicMapField *this_01;
  FieldDescriptor *this_02;
  long lVar14;
  long i;
  undefined8 *puVar15;
  
  pTVar2 = this->type_info_;
  pDVar3 = pTVar2->type;
  if (0 < *(int *)(pDVar3 + 0x38)) {
    iVar12 = 0;
    iVar13 = 0;
    do {
      *(undefined4 *)
       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
       (long)(pTVar2->oneof_case_offset + iVar12)) = 0;
      iVar13 = iVar13 + 1;
      iVar12 = iVar12 + 4;
    } while (iVar13 < *(int *)(pDVar3 + 0x38));
  }
  *(undefined8 *)
   ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
   (long)pTVar2->internal_metadata_offset) = 0;
  if ((long)pTVar2->extensions_offset != -1) {
    internal::ExtensionSet::ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
               (long)pTVar2->extensions_offset));
  }
  if (0 < *(int *)(pDVar3 + 0x2c)) {
    lVar14 = 0xa0;
    i = 0;
    do {
      lVar4 = *(long *)(pDVar3 + 0x30);
      puVar9 = internal::scoped_array<unsigned_int>::operator[](&this->type_info_->offsets,i);
      if (*(long *)(lVar4 + -0x40 + lVar14) == 0) {
        this_02 = (FieldDescriptor *)(lVar4 + lVar14 + -0xa0);
        uVar1 = *puVar9;
        TVar7 = FieldDescriptor::type(this_02);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4) - 1U < 10) {
          this_01 = (DynamicMapField *)
                    ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(int)uVar1);
          switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4)) {
          default:
            if (*(int *)(lVar4 + -0x54 + lVar14) == 3) goto LAB_003119cd;
            uVar8 = *(undefined4 *)(lVar4 + lVar14);
LAB_003119a7:
            *(undefined4 *)
             &(this_01->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = uVar8;
            break;
          case 2:
          case 4:
            if (*(int *)(lVar4 + -0x54 + lVar14) == 3) goto LAB_003119cd;
            pp_Var11 = *(_func_int ***)(lVar4 + lVar14);
LAB_00311a57:
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = pp_Var11;
            break;
          case 5:
            if (*(int *)(lVar4 + -0x54 + lVar14) == 3) goto LAB_003119cd;
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = *(_func_int ***)(lVar4 + lVar14);
            break;
          case 6:
            if (*(int *)(lVar4 + -0x54 + lVar14) == 3) goto LAB_003119cd;
            *(undefined4 *)
             &(this_01->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = *(undefined4 *)(lVar4 + lVar14);
            break;
          case 7:
            if (*(int *)(lVar4 + -0x54 + lVar14) == 3) goto LAB_003119cd;
            *(undefined1 *)
             &(this_01->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = *(undefined1 *)(lVar4 + lVar14);
            break;
          case 8:
            if (*(int *)(lVar4 + -0x54 + lVar14) != 3) {
              pEVar10 = FieldDescriptor::default_value_enum(this_02);
              uVar8 = *(undefined4 *)(pEVar10 + 0x10);
              goto LAB_003119a7;
            }
LAB_003119cd:
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.arena_ = (Arena *)0x0;
            break;
          case 9:
            if (*(int *)(lVar4 + -0x54 + lVar14) != 3) {
              pDVar5 = this->type_info_->prototype;
              if (pDVar5 == this || pDVar5 == (DynamicMessage *)0x0) {
                puVar15 = (undefined8 *)(lVar4 + lVar14);
              }
              else {
                puVar9 = internal::scoped_array<unsigned_int>::operator[]
                                   (&this->type_info_->offsets,i);
                puVar15 = (undefined8 *)
                          ((long)&(pDVar5->super_Message).super_MessageLite._vptr_MessageLite +
                          (long)(int)*puVar9);
              }
              pp_Var11 = (_func_int **)*puVar15;
              goto LAB_00311a57;
            }
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.arena_ = (Arena *)0x0;
            (this_01->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.repeated_field_ = (RepeatedPtrField<google::protobuf::Message> *)0x0;
            break;
          case 10:
            if (*(int *)(lVar4 + -0x54 + lVar14) == 3) {
              bVar6 = FieldDescriptor::is_map(this_02);
              if (bVar6) {
                this_00 = this->type_info_->factory;
                type = FieldDescriptor::message_type(this_02);
                default_entry = DynamicMessageFactory::GetPrototypeNoLock(this_00,type);
                internal::DynamicMapField::DynamicMapField(this_01,default_entry);
              }
              else {
                (this_01->
                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                ).super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
                (this_01->
                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                ).super_MapFieldBase.arena_ = (Arena *)0x0;
                (this_01->
                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                ).super_MapFieldBase.repeated_field_ =
                     (RepeatedPtrField<google::protobuf::Message> *)0x0;
              }
            }
            else {
              (this_01->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
            }
          }
        }
      }
      i = i + 1;
      lVar14 = lVar14 + 0xa8;
    } while (i < *(int *)(pDVar3 + 0x2c));
  }
  return;
}

Assistant:

void DynamicMessage::SharedCtor() {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->type;
  // Initialize oneof cases.
  for (int i = 0 ; i < descriptor->oneof_decl_count(); ++i) {
    new (OffsetToPointer(type_info_->oneof_case_offset + sizeof(uint32) * i))
        uint32(0);
  }

  new (OffsetToPointer(type_info_->internal_metadata_offset))
      InternalMetadataWithArena;

  if (type_info_->extensions_offset != -1) {
    new (OffsetToPointer(type_info_->extensions_offset)) ExtensionSet;
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);
    if (field->containing_oneof()) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                           \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
        if (!field->is_repeated()) {                                         \
          new(field_ptr) TYPE(field->default_value_##TYPE());                \
        } else {                                                             \
          new(field_ptr) RepeatedField<TYPE>();                              \
        }                                                                    \
        break;

      HANDLE_TYPE(INT32 , int32 );
      HANDLE_TYPE(INT64 , int64 );
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT , float );
      HANDLE_TYPE(BOOL  , bool  );
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new(field_ptr) int(field->default_value_enum()->number());
        } else {
          new(field_ptr) RepeatedField<int>();
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            if (!field->is_repeated()) {
              const string* default_value;
              if (is_prototype()) {
                default_value = &field->default_value_string();
              } else {
                default_value = &(reinterpret_cast<const ArenaStringPtr*>(
                                      type_info_->prototype->OffsetToPointer(
                                          type_info_->offsets[i]))
                                      ->Get());
              }
              ArenaStringPtr* asp = new(field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(default_value);
            } else {
              new(field_ptr) RepeatedPtrField<string>();
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new(field_ptr) Message*(NULL);
        } else {
          if (IsMapFieldInApi(field)) {
            new (field_ptr) DynamicMapField(
                type_info_->factory->GetPrototypeNoLock(field->message_type()));
          } else {
            new (field_ptr) RepeatedPtrField<Message>();
          }
        }
        break;
      }
    }
  }
}